

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O2

void CheckEqualsHelper(char *file,int line,char *expected_source,char *expected,char *value_source,
                      char *value)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  if ((expected_source != (char *)0x0 || expected == (char *)0x0) &&
     (expected != (char *)0x0 || expected_source == (char *)0x0)) {
    if (expected != (char *)0x0 && expected_source != (char *)0x0) {
      iVar1 = strcmp(expected_source,expected);
      if (iVar1 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fixed-dtoa.cc"
               ,(ulong)file & 0xffffffff,CONCAT44(in_register_00000034,line),"buffer.start()",
               expected_source,expected);
        abort();
      }
    }
    return;
  }
  abort();
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     const char* expected,
                                     const char* value_source,
                                     const char* value) {
  if ((expected == NULL && value != NULL) ||
      (expected != NULL && value == NULL)) {
    abort();
  }

  if ((expected != NULL && value != NULL && strcmp(expected, value) != 0)) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %s\n"
           "#  Found:    %s\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}